

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_platform.c
# Opt level: O0

__fd_t light_open(char *file_name,__read_mode_t mode)

{
  int in_ESI;
  char *in_RDI;
  __fd_t fd;
  FILE *local_18;
  
  local_18 = (FILE *)0x0;
  if (in_ESI == 0) {
    local_18 = fopen(in_RDI,"rb");
  }
  else if (in_ESI == 1) {
    local_18 = fopen(in_RDI,"wb");
  }
  else if (in_ESI == 2) {
    local_18 = fopen(in_RDI,"ab");
  }
  return (__fd_t)local_18;
}

Assistant:

__fd_t light_open(const char *file_name, const __read_mode_t mode)
{
	__fd_t fd = (__fd_t)INVALID_FILE;

	switch (mode) {
	case LIGHT_OREAD:
		fd = fopen(file_name, "rb");
		break;
	case LIGHT_OWRITE:
		fd = fopen(file_name, "wb");
		break;
	case LIGHT_OAPPEND:
		fd = fopen(file_name, "ab");
		break;
	}

	return fd;
}